

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void google::protobuf::internal::MapFieldBase::UnsafeShallowSwapImpl
               (MapFieldBase *lhs,MapFieldBase *rhs)

{
  TaggedPtr TVar1;
  Arena *pAVar2;
  Arena *pAVar3;
  string *psVar4;
  ReflectionPayload *pRVar5;
  long *plVar6;
  long alStack_28 [2];
  
  plVar6 = alStack_28;
  pAVar2 = arena(lhs);
  pAVar3 = arena(rhs);
  if (pAVar2 == pAVar3) {
    psVar4 = (string *)0x0;
  }
  else {
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (pAVar2,pAVar3,"lhs.arena() == rhs.arena()");
  }
  if (psVar4 != (string *)0x0) {
    UnsafeShallowSwapImpl();
    if ((plVar6[1] & 1) == 0) {
      pRVar5 = (ReflectionPayload *)0x0;
    }
    else {
      pRVar5 = ToPayload(plVar6[1]);
    }
    if (pRVar5 != (ReflectionPayload *)0x0) {
      absl::lts_20240722::Mutex::Lock();
      (**(code **)(*plVar6 + 0x48))(plVar6);
      absl::lts_20240722::Mutex::Unlock();
    }
    return;
  }
  TVar1 = (rhs->payload_)._M_i;
  (rhs->payload_)._M_i = (lhs->payload_)._M_i;
  (lhs->payload_)._M_i = TVar1;
  return;
}

Assistant:

void MapFieldBase::UnsafeShallowSwapImpl(MapFieldBase& lhs, MapFieldBase& rhs) {
  ABSL_DCHECK_EQ(lhs.arena(), rhs.arena());
  lhs.InternalSwap(&rhs);
}